

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

bool __thiscall
caffe::RecurrentParameter::MergePartialFromCodedStream
          (RecurrentParameter *this,CodedInputStream *input)

{
  byte bVar1;
  uint8 uVar2;
  byte *pbVar3;
  void *pvVar4;
  uint8 *puVar5;
  bool bVar6;
  uint32 uVar7;
  FillerParameter *pFVar8;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  int64 iVar9;
  int iVar10;
  UnknownFieldSet *unknown_fields;
  char cVar11;
  uint tag;
  ulong uVar12;
  pair<unsigned_long,_bool> pVar13;
  pair<unsigned_long,_bool> pVar14;
  int local_50;
  int local_4c;
  
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar7 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00428104;
      input->buffer_ = pbVar3 + 1;
      uVar12 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00428104:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar12 = 0;
      if (uVar7 - 1 < 0x7f) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar7 | uVar12;
    }
    tag = (uint)uVar12;
    if ((uVar12 & 0x100000000) == 0) goto switchD_00428188_default;
    cVar11 = (char)uVar12;
    switch((uint)(uVar12 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar11 != '\b') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar1 = *pbVar3;
        uVar7 = (uint32)bVar1;
        if (-1 < (char)bVar1) {
          this->num_output_ = (uint)bVar1;
          input->buffer_ = pbVar3 + 1;
          goto LAB_00428165;
        }
      }
      else {
        uVar7 = 0;
      }
      iVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
      this->num_output_ = (uint32)iVar9;
      if (iVar9 < 0) goto LAB_00428349;
      goto LAB_00428165;
    case 2:
      if (cVar11 != '\x12') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      if (this->weight_filler_ == (FillerParameter *)0x0) {
        pFVar8 = (FillerParameter *)operator_new(0x40);
        FillerParameter::FillerParameter(pFVar8);
        this->weight_filler_ = pFVar8;
      }
      MergePartialFromCodedStream();
      iVar10 = local_4c;
      uVar12 = extraout_RAX_00;
joined_r0x0042823c:
      if ((uVar12 & 1) == 0) goto LAB_00428165;
      goto LAB_00428167;
    case 3:
      if (cVar11 == '\x1a') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        if (this->bias_filler_ == (FillerParameter *)0x0) {
          pFVar8 = (FillerParameter *)operator_new(0x40);
          FillerParameter::FillerParameter(pFVar8);
          this->bias_filler_ = pFVar8;
        }
        MergePartialFromCodedStream();
        iVar10 = local_50;
        uVar12 = extraout_RAX;
        goto joined_r0x0042823c;
      }
      break;
    case 4:
      if (cVar11 == ' ') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar2 = *puVar5, -1 < (long)(char)uVar2)) {
          input->buffer_ = puVar5 + 1;
          pVar14._8_8_ = 1;
          pVar14.first = (long)(char)uVar2;
        }
        else {
          pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        iVar10 = 6;
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->debug_info_ = pVar14.first != 0;
          goto LAB_00428165;
        }
        goto LAB_00428167;
      }
      break;
    case 5:
      if (cVar11 == '(') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar2 = *puVar5, -1 < (long)(char)uVar2)) {
          input->buffer_ = puVar5 + 1;
          pVar13._8_8_ = 1;
          pVar13.first = (long)(char)uVar2;
        }
        else {
          pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        iVar10 = 6;
        if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->expose_hidden_ = pVar13.first != 0;
          goto LAB_00428165;
        }
        goto LAB_00428167;
      }
    }
switchD_00428188_default:
    iVar10 = 7;
    if ((tag & 7) != 4 && tag != 0) {
      pvVar4 = (this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_;
      if (((ulong)pvVar4 & 1) == 0) {
        unknown_fields =
             google::protobuf::internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
      }
      else {
        unknown_fields = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
      }
      bVar6 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
      if (bVar6) {
LAB_00428165:
        iVar10 = 0;
      }
      else {
LAB_00428349:
        iVar10 = 6;
      }
    }
LAB_00428167:
    if (iVar10 != 0) {
      return iVar10 != 6;
    }
  } while( true );
}

Assistant:

bool RecurrentParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.RecurrentParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional uint32 num_output = 1 [default = 0];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_num_output();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &num_output_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.FillerParameter weight_filler = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_weight_filler()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.FillerParameter bias_filler = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias_filler()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool debug_info = 4 [default = false];
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          set_has_debug_info();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &debug_info_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool expose_hidden = 5 [default = false];
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          set_has_expose_hidden();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &expose_hidden_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.RecurrentParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.RecurrentParameter)
  return false;
#undef DO_
}